

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::(anonymous_namespace)::getCurrentTimestamp_abi_cxx11_(void)

{
  string *in_RDI;
  char *fmt;
  char timeStamp [21];
  tm *timeInfo;
  unsigned_long timeStampSize;
  time_t rawtime;
  allocator local_41;
  char *local_40;
  char local_38 [24];
  tm *local_20;
  undefined8 local_18;
  time_t local_10 [2];
  
  time(local_10);
  local_18 = 0x15;
  local_20 = gmtime(local_10);
  local_40 = "%Y-%m-%dT%H:%M:%SZ";
  strftime(local_38,0x15,"%Y-%m-%dT%H:%M:%SZ",local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_38,0x14,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return in_RDI;
}

Assistant:

std::string getCurrentTimestamp() {
            // Beware, this is not reentrant because of backward compatibility issues
            // Also, UTC only, again because of backward compatibility (%z is C++11)
            time_t rawtime;
            std::time(&rawtime);
            auto const timeStampSize = sizeof("2017-01-16T17:06:45Z");

#ifdef _MSC_VER
            std::tm timeInfo = {};
            gmtime_s(&timeInfo, &rawtime);
#else
            std::tm* timeInfo;
            timeInfo = std::gmtime(&rawtime);
#endif

            char timeStamp[timeStampSize];
            const char * const fmt = "%Y-%m-%dT%H:%M:%SZ";

#ifdef _MSC_VER
            std::strftime(timeStamp, timeStampSize, fmt, &timeInfo);
#else
            std::strftime(timeStamp, timeStampSize, fmt, timeInfo);
#endif
            return std::string(timeStamp, timeStampSize-1);
        }